

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O2

void __thiscall HFactor::rlinkDel(HFactor *this,int index)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  int *piVar6;
  
  piVar3 = (this->rlinkLast).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[index];
  lVar5 = (long)iVar1;
  piVar4 = (this->rlinkNext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar4[index];
  piVar6 = piVar4 + lVar5;
  if (lVar5 < 0) {
    piVar6 = (this->rlinkFirst).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (-2 - lVar5);
  }
  *piVar6 = iVar2;
  if (-1 < (long)iVar2) {
    piVar3[iVar2] = iVar1;
  }
  return;
}

Assistant:

void rlinkDel(const int index) {
        const int xlast = rlinkLast[index];
        const int xnext = rlinkNext[index];
        if (xlast >= 0)
            rlinkNext[xlast] = xnext;
        else
            rlinkFirst[-xlast - 2] = xnext;
        if (xnext >= 0)
            rlinkLast[xnext] = xlast;
    }